

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O0

void Nf_ObjComputeRequired(Nf_Man_t *p,int iObj)

{
  int iVar1;
  Nf_Obj_t *pNVar2;
  int *pCutSet_00;
  int *pCutSet;
  int c;
  Nf_Obj_t *pBest;
  int iObj_local;
  Nf_Man_t *p_local;
  
  pNVar2 = Nf_ManObj(p,iObj);
  pCutSet_00 = Nf_ObjCutSet(p,iObj);
  for (pCutSet._4_4_ = 0; pCutSet._4_4_ < 2; pCutSet._4_4_ = pCutSet._4_4_ + 1) {
    iVar1 = Nf_ObjRequired(p,iObj,pCutSet._4_4_);
    if (iVar1 == 0x3fffffff) {
      iVar1 = Nf_CutRequired(p,pNVar2->M[pCutSet._4_4_],pCutSet_00);
      Nf_ObjSetRequired(p,iObj,pCutSet._4_4_,iVar1);
    }
  }
  return;
}

Assistant:

static inline void Nf_ObjComputeRequired( Nf_Man_t * p, int iObj )
{
    Nf_Obj_t * pBest = Nf_ManObj(p, iObj);
    int c, * pCutSet = Nf_ObjCutSet( p, iObj );
    for ( c = 0; c < 2; c++ )
        if ( Nf_ObjRequired(p, iObj, c) == SCL_INFINITY )
            Nf_ObjSetRequired( p, iObj, c, Nf_CutRequired(p, &pBest->M[c][0], pCutSet) );
}